

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O2

void bitset_flip_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  long lVar1;
  
  for (lVar1 = 0; length * 2 != lVar1; lVar1 = lVar1 + 2) {
    words[*(ushort *)((long)list + lVar1) >> 6] =
         words[*(ushort *)((long)list + lVar1) >> 6] ^
         1L << ((byte)*(ushort *)((long)list + lVar1) & 0x3f);
  }
  return;
}

Assistant:

void bitset_flip_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    uint64_t offset, load, newload, pos, index;
    const uint16_t *end = list + length;
    while (list != end) {
        pos = *list;
        offset = pos >> 6;
        index = pos % 64;
        load = words[offset];
        newload = load ^ (UINT64_C(1) << index);
        words[offset] = newload;
        list++;
    }
}